

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

void __thiscall Liby::Connection::sync_send(Connection *this,Buffer *buffer)

{
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  void *__buf;
  ssize_t sVar4;
  size_t in_RCX;
  int nbytes;
  anon_class_8_1_8991fb9c local_60;
  function<void_()> local_58;
  undefined1 local_38 [8];
  DeferCaller defer;
  Buffer *buffer_local;
  Connection *this_local;
  
  defer.functor_._M_invoker = (_Invoker_type)buffer;
  peVar2 = std::__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )&this->socket_);
  Socket::setNoblock(peVar2,false);
  local_60.this = this;
  std::function<void()>::function<Liby::Connection::sync_send(Liby::Buffer&)::__0,void>
            ((function<void()> *)&local_58,&local_60);
  DeferCaller::DeferCaller((DeferCaller *)local_38,&local_58);
  std::function<void_()>::~function(&local_58);
  while (bVar1 = Buffer::empty((Buffer *)defer.functor_._M_invoker), ((bVar1 ^ 0xffU) & 1) != 0) {
    peVar2 = std::__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->socket_);
    pcVar3 = Buffer::data((Buffer *)defer.functor_._M_invoker);
    __buf = (void *)Buffer::size((Buffer *)defer.functor_._M_invoker);
    sVar4 = Socket::write(peVar2,(int)pcVar3,__buf,in_RCX);
    if ((int)sVar4 < 1) break;
    Buffer::retrieve((Buffer *)defer.functor_._M_invoker,(long)(int)sVar4);
  }
  DeferCaller::~DeferCaller((DeferCaller *)local_38);
  return;
}

Assistant:

void Connection::sync_send(Buffer &buffer) {
    socket_->setNoblock(false);
    DeferCaller defer([this] { socket_->setNoblock(); });
    while (!buffer.empty()) {
        int nbytes =
            socket_->write(static_cast<void *>(buffer.data()), buffer.size());
        if (nbytes > 0) {
            buffer.retrieve(nbytes);
        } else {
            break;
        }
    }
}